

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# substring.cpp
# Opt level: O1

string_t __thiscall
duckdb::SubstringUnicode(duckdb *this,Vector *result,string_t input,int64_t offset,int64_t length)

{
  ulong uVar1;
  long lVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  ulong input_size;
  ulong uVar6;
  long lVar7;
  char *input_data;
  anon_struct_16_3_d7536bce_for_pointer aVar8;
  anon_union_16_2_67f50693_for_value aVar9;
  undefined8 local_40;
  char *local_38;
  
  lVar7 = input.value._8_8_;
  local_38 = input.value._0_8_;
  input_size = (ulong)result & 0xffffffff;
  input_data = (char *)((long)&local_40 + 4);
  if (0xc < input_size) {
    input_data = local_38;
  }
  local_40 = result;
  AssertInSupportedRange(input_size,lVar7,offset);
  if (offset == 0) {
    aVar9.pointer = (anon_struct_16_3_d7536bce_for_pointer)SubstringEmptyString((Vector *)this);
  }
  else {
    if (lVar7 < 0) {
      lVar7 = 1 - lVar7;
      lVar2 = lVar7 - offset;
      if (offset < 0) {
        lVar2 = lVar7;
        lVar7 = lVar7 - offset;
      }
      uVar1 = 0xffffffffffffffff;
      if (lVar2 < 1) {
        uVar1 = input_size;
      }
      if (input_size != 0) {
        lVar4 = 0;
        do {
          lVar4 = lVar4 + 1;
          if (lVar4 == lVar7) goto LAB_014e88e0;
          if (lVar4 == lVar2) {
            uVar1 = input_size;
          }
          input_size = input_size - 1;
        } while (input_size != 0);
      }
      input_size = 0;
LAB_014e88e0:
      if (uVar1 == 0xffffffffffffffff) {
        aVar8 = (anon_struct_16_3_d7536bce_for_pointer)SubstringEmptyString((Vector *)this);
        return (string_t)aVar8;
      }
    }
    else {
      lVar7 = lVar7 + -1;
      if (offset < 0) {
        lVar2 = 0;
        if (0 < offset + lVar7) {
          lVar2 = offset + lVar7;
        }
      }
      else {
        lVar2 = 0;
        if (0 < lVar7) {
          lVar2 = lVar7;
        }
        lVar7 = lVar7 + offset;
      }
      uVar6 = 0xffffffffffffffff;
      uVar1 = input_size;
      if (input_size != 0) {
        uVar3 = 0;
        lVar4 = 0;
        do {
          uVar5 = uVar3;
          if ((lVar4 != lVar2) && (uVar5 = uVar6, uVar1 = uVar3, lVar4 == lVar7)) break;
          lVar4 = lVar4 + 1;
          uVar3 = uVar3 + 1;
          uVar6 = uVar5;
          uVar1 = input_size;
        } while (input_size != uVar3);
      }
      input_size = uVar6;
      if (lVar7 <= lVar2 || input_size == 0xffffffffffffffff) {
        aVar8 = (anon_struct_16_3_d7536bce_for_pointer)SubstringEmptyString((Vector *)this);
        return (string_t)aVar8;
      }
    }
    aVar9.pointer =
         (anon_struct_16_3_d7536bce_for_pointer)
         SubstringSlice((Vector *)this,input_data,input_size,uVar1 - input_size);
  }
  return (anon_union_16_2_67f50693_for_value)(anon_union_16_2_67f50693_for_value)aVar9.pointer;
}

Assistant:

string_t SubstringUnicode(Vector &result, string_t input, int64_t offset, int64_t length) {
	auto input_data = input.GetData();
	auto input_size = input.GetSize();

	AssertInSupportedRange(input_size, offset, length);

	if (length == 0) {
		return SubstringEmptyString(result);
	}
	// first figure out which direction we need to scan
	idx_t start_pos;
	idx_t end_pos;
	if (offset < 0) {
		start_pos = 0;
		end_pos = DConstants::INVALID_INDEX;

		// negative offset: scan backwards
		int64_t start, end;

		// we express start and end as unicode codepoints from the back
		offset--;
		if (length < 0) {
			// negative length
			start = -offset - length;
			end = -offset;
		} else {
			// positive length
			start = -offset;
			end = -offset - length;
		}
		if (end <= 0) {
			end_pos = input_size;
		}
		int64_t current_character = 0;
		for (idx_t i = input_size; i > 0; i--) {
			if (IsCharacter(input_data[i - 1])) {
				current_character++;
				if (current_character == start) {
					start_pos = i;
					break;
				} else if (current_character == end) {
					end_pos = i;
				}
			}
		}
		while (!IsCharacter(input_data[start_pos])) {
			start_pos++;
		}
		while (end_pos < input_size && !IsCharacter(input_data[end_pos])) {
			end_pos++;
		}

		if (end_pos == DConstants::INVALID_INDEX) {
			return SubstringEmptyString(result);
		}
	} else {
		start_pos = DConstants::INVALID_INDEX;
		end_pos = input_size;

		// positive offset: scan forwards
		int64_t start, end;

		// we express start and end as unicode codepoints from the front
		offset--;
		if (length < 0) {
			// negative length
			start = MaxValue<int64_t>(0, offset + length);
			end = offset;
		} else {
			// positive length
			start = MaxValue<int64_t>(0, offset);
			end = offset + length;
		}

		int64_t current_character = 0;
		for (idx_t i = 0; i < input_size; i++) {
			if (IsCharacter(input_data[i])) {
				if (current_character == start) {
					start_pos = i;
				} else if (current_character == end) {
					end_pos = i;
					break;
				}
				current_character++;
			}
		}
		if (start_pos == DConstants::INVALID_INDEX || end == 0 || end <= start) {
			return SubstringEmptyString(result);
		}
	}
	D_ASSERT(end_pos >= start_pos);
	// after we have found these, we can slice the substring
	return SubstringSlice(result, input_data, UnsafeNumericCast<int64_t>(start_pos),
	                      UnsafeNumericCast<int64_t>(end_pos - start_pos));
}